

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

bool __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::required
          (child_t<clipp::parameter,_clipp::group> *this)

{
  byte bVar1;
  child_t<clipp::parameter,_clipp::group> *pcVar2;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  _Var3;
  
  if (this->type_ == group) {
    bVar1 = (this->m_).group.exclusive_;
    if ((bool)bVar1 == true) {
      pcVar2 = (child_t<clipp::parameter,_clipp::group> *)
               (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
               super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_negate<clipp::group::all_required()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                        ((this->m_).param.super_action_provider<clipp::parameter>.argActions_.
                         super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pcVar2);
      if (pcVar2 == _Var3._M_current) {
        return true;
      }
      bVar1 = (this->m_).group.exclusive_;
    }
    if ((bVar1 & 1) == 0) {
      pcVar2 = (child_t<clipp::parameter,_clipp::group> *)
               (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
               super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::any_required()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                        ((this->m_).param.super_action_provider<clipp::parameter>.argActions_.
                         super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pcVar2);
      return pcVar2 != _Var3._M_current;
    }
  }
  else if (this->type_ == param) {
    return (this->m_).param.required_;
  }
  return false;
}

Assistant:

bool required() const noexcept {
            switch(type_) {
                case type::param: return m_.param.required();
                case type::group:
                    return (m_.group.exclusive() && m_.group.all_required() ) ||
                          (!m_.group.exclusive() && m_.group.any_required()  );
                default: return false;
            }
        }